

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bool __thiscall
fmt::v11::format_facet<std::locale>::do_put
          (format_facet<std::locale> *this,appender out,loc_value val,format_specs *specs)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  loc_writer<char> *in_RSI;
  undefined7 in_stack_ffffffffffffff40;
  
  std::__cxx11::string::string
            (in_RDX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI);
  std::__cxx11::string::string
            (in_RDX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI);
  std::__cxx11::string::string
            (in_RDX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI);
  bVar1 = loc_value::visit<fmt::v11::detail::loc_writer<char>>((loc_value *)in_RDX,in_RSI);
  detail::loc_writer<char>::~loc_writer
            ((loc_writer<char> *)CONCAT17(bVar1,in_stack_ffffffffffffff40));
  return (bool)(bVar1 & 1);
}

Assistant:

FMT_API FMT_FUNC auto format_facet<std::locale>::do_put(
    appender out, loc_value val, const format_specs& specs) const -> bool {
  return val.visit(
      detail::loc_writer<>{out, specs, separator_, grouping_, decimal_point_});
}